

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O2

void __thiscall
HACD::RaycastMesh::Initialize
          (RaycastMesh *this,size_t nVertices,size_t nTriangles,Vec3<double> *vertices,
          Vec3<long> *triangles,size_t maxDepth,size_t minLeafSize,Float minAxisSize)

{
  RMNode *pRVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong *puVar4;
  ulong *puVar5;
  size_t sVar6;
  size_t t;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  ulong local_38;
  
  auVar11 = in_ZMM1._0_16_;
  this->m_triangles = triangles;
  this->m_vertices = vertices;
  this->m_nVertices = nVertices;
  this->m_nTriangles = nTriangles;
  pRVar1 = this->m_nodes;
  if (pRVar1 != (RMNode *)0x0) {
    lVar3 = *(long *)&pRVar1[-1].m_leaf;
    if (lVar3 != 0) {
      lVar7 = lVar3 * 0xf0;
      do {
        SArray<long,_16UL>::~SArray((SArray<long,_16UL> *)((long)pRVar1 + lVar7 + -0xa8));
        auVar11 = in_ZMM1._0_16_;
        lVar7 = lVar7 + -0xf0;
      } while (lVar7 != 0);
    }
    operator_delete__(&pRVar1[-1].m_leaf,lVar3 * 0xf0 | 8);
  }
  lVar3 = 1L << (maxDepth & 0x3f);
  lVar7 = 0;
  uVar9 = 0;
  this->m_nNodes = 0;
  this->m_nMaxNodes = 0;
  sVar6 = maxDepth;
  while (bVar10 = sVar6 != 0, sVar6 = sVar6 - 1, bVar10) {
    uVar9 = uVar9 + lVar3;
    lVar7 = lVar7 + lVar3 * 0xf0;
    this->m_nMaxNodes = uVar9;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar9;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xf0),8) == 0) {
    uVar8 = SUB168(auVar2 * ZEXT816(0xf0),0) | 8;
  }
  puVar4 = (ulong *)operator_new__(uVar8);
  *puVar4 = uVar9;
  if (uVar9 != 0) {
    auVar11 = vpcmpeqd_avx(auVar11,auVar11);
    puVar5 = puVar4;
    do {
      puVar5[0x1a] = 0;
      puVar5[0x1b] = 0;
      puVar5[0x1c] = 0x10;
      *(undefined1 (*) [16])(puVar5 + 1) = auVar11;
      puVar5[3] = 0xffffffffffffffff;
      puVar5[0x1d] = 0;
      *(undefined1 *)(puVar5 + 0x1e) = 0;
      lVar7 = lVar7 + -0xf0;
      puVar5 = puVar5 + 0x1e;
    } while (lVar7 != 0);
  }
  this->m_nodes = (RMNode *)(puVar4 + 1);
  this->m_nNodes = 1;
  SArray<long,_16UL>::Resize((SArray<long,_16UL> *)(puVar4 + 10),nTriangles);
  for (uVar9 = 0; uVar9 < this->m_nTriangles; uVar9 = uVar9 + 1) {
    local_38 = uVar9;
    SArray<long,_16UL>::PushBack((SArray<long,_16UL> *)(puVar4 + 10),(long *)&local_38);
  }
  puVar4[0x1d] = (ulong)this;
  puVar4[1] = 0;
  RMNode::Create((RMNode *)(puVar4 + 1),0,maxDepth,minLeafSize,minAxisSize);
  return;
}

Assistant:

void RaycastMesh::Initialize(size_t nVertices, size_t nTriangles, 
								Vec3<Float> *  vertices,  Vec3<long> * triangles, 
								size_t maxDepth, size_t minLeafSize, Float minAxisSize)
	{
		m_triangles  = triangles;			
		m_vertices   = vertices;		
		m_nVertices  = nVertices;
		m_nTriangles = nTriangles;
		delete [] m_nodes;
		m_nNodes = 0;
		m_nMaxNodes = 0;
		for(size_t k = 0; k < maxDepth; k++)
		{
			m_nMaxNodes += ((size_t)1 << maxDepth);
		}
		m_nodes = new RMNode[m_nMaxNodes];
		RMNode & root = m_nodes[AddNode()];
		root.m_triIDs.Resize(nTriangles);
		for(size_t t = 0; t < m_nTriangles; ++t) root.m_triIDs.PushBack((long)t);
		root.m_rm = this;
		root.m_id = 0;
		root.Create(0, maxDepth, minLeafSize, minAxisSize);
	}